

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O3

void push_heap_suite::push_sequence(void)

{
  int iVar1;
  bool bVar2;
  int __tmp;
  ulong uVar3;
  int __tmp_2;
  ulong uVar4;
  int aiStack_a8 [16];
  array<int,_15UL> expect;
  int local_2c;
  
  aiStack_a8[10] = 0;
  aiStack_a8[0xb] = 0;
  aiStack_a8[0xc] = 0;
  aiStack_a8[0xd] = 0;
  aiStack_a8[6] = 0;
  aiStack_a8[7] = 0;
  aiStack_a8[8] = 0;
  aiStack_a8[9] = 0;
  aiStack_a8[2] = 0;
  aiStack_a8[3] = 0;
  aiStack_a8[4] = 0;
  aiStack_a8[5] = 0;
  aiStack_a8[0xe] = 0;
  aiStack_a8[0xf] = 0;
  aiStack_a8[1] = 8;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[9] = 0;
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[0xc] = 0;
  expect._M_elems[5] = 0;
  expect._M_elems[6] = 0;
  expect._M_elems[7] = 0;
  expect._M_elems[8] = 0;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  expect._M_elems[0] = 8;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x113,"void push_heap_suite::push_sequence()",aiStack_a8 + 1,expect._M_elems,
             expect._M_elems,&local_2c);
  iVar1 = aiStack_a8[1];
  aiStack_a8[2] = 3;
  if (aiStack_a8[1] < 3) {
    aiStack_a8[1] = 3;
    aiStack_a8[2] = iVar1;
  }
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[6] = 0;
  expect._M_elems[7] = 0;
  expect._M_elems[8] = 0;
  expect._M_elems[9] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  expect._M_elems[5] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[0] = 8;
  expect._M_elems[1] = 3;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x11a,"void push_heap_suite::push_sequence()",aiStack_a8 + 1,expect._M_elems,
             expect._M_elems,&local_2c);
  iVar1 = aiStack_a8[1];
  aiStack_a8[3] = 6;
  if (aiStack_a8[1] < 6) {
    aiStack_a8[1] = 6;
    aiStack_a8[3] = iVar1;
  }
  expect._M_elems[0xb] = 0;
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[7] = 0;
  expect._M_elems[8] = 0;
  expect._M_elems[9] = 0;
  expect._M_elems[10] = 0;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  expect._M_elems[5] = 0;
  expect._M_elems[6] = 0;
  expect._M_elems[0] = 8;
  expect._M_elems[1] = 3;
  expect._M_elems[2] = 6;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x121,"void push_heap_suite::push_sequence()",aiStack_a8 + 1,expect._M_elems,
             expect._M_elems,&local_2c);
  aiStack_a8[4] = 9;
  uVar3 = 4;
  uVar4 = 2;
  do {
    iVar1 = aiStack_a8[uVar4];
    if (aiStack_a8[uVar3] <= iVar1) break;
    aiStack_a8[uVar4] = aiStack_a8[uVar3];
    aiStack_a8[uVar3] = iVar1;
    bVar2 = 1 < uVar4;
    uVar3 = uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 0;
  expect._M_elems[9] = 0;
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[4] = 0;
  expect._M_elems[5] = 0;
  expect._M_elems[6] = 0;
  expect._M_elems[7] = 0;
  expect._M_elems[0] = 9;
  expect._M_elems[1] = 8;
  expect._M_elems[2] = 6;
  expect._M_elems[3] = 3;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x128,"void push_heap_suite::push_sequence()",aiStack_a8 + 1,expect._M_elems,
             expect._M_elems,&local_2c);
  aiStack_a8[5] = 5;
  uVar3 = 5;
  uVar4 = 2;
  do {
    iVar1 = aiStack_a8[uVar4];
    if (aiStack_a8[uVar3] <= iVar1) break;
    aiStack_a8[uVar4] = aiStack_a8[uVar3];
    aiStack_a8[uVar3] = iVar1;
    bVar2 = 1 < uVar4;
    uVar3 = uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  expect._M_elems[9] = 0;
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[0xc] = 0;
  expect._M_elems[5] = 0;
  expect._M_elems[6] = 0;
  expect._M_elems[7] = 0;
  expect._M_elems[8] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[0] = 9;
  expect._M_elems[1] = 8;
  expect._M_elems[2] = 6;
  expect._M_elems[3] = 3;
  expect._M_elems[4] = 5;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x12f,"void push_heap_suite::push_sequence()",aiStack_a8 + 1,expect._M_elems,
             expect._M_elems,&local_2c);
  aiStack_a8[6] = 2;
  uVar3 = 6;
  uVar4 = 3;
  do {
    iVar1 = aiStack_a8[uVar4];
    if (aiStack_a8[uVar3] <= iVar1) break;
    aiStack_a8[uVar4] = aiStack_a8[uVar3];
    aiStack_a8[uVar3] = iVar1;
    bVar2 = 1 < uVar4;
    uVar3 = uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[6] = 0;
  expect._M_elems[7] = 0;
  expect._M_elems[8] = 0;
  expect._M_elems[9] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[0] = 9;
  expect._M_elems[1] = 8;
  expect._M_elems[2] = 6;
  expect._M_elems[3] = 3;
  expect._M_elems[4] = 5;
  expect._M_elems[5] = 2;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x136,"void push_heap_suite::push_sequence()",aiStack_a8 + 1,expect._M_elems,
             expect._M_elems,&local_2c);
  aiStack_a8[7] = 0xf;
  uVar3 = 7;
  uVar4 = 3;
  do {
    iVar1 = aiStack_a8[uVar4];
    if (aiStack_a8[uVar3] <= iVar1) break;
    aiStack_a8[uVar4] = aiStack_a8[uVar3];
    aiStack_a8[uVar3] = iVar1;
    bVar2 = 1 < uVar4;
    uVar3 = uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 0;
  expect._M_elems[9] = 0;
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[4] = 5;
  expect._M_elems[5] = 2;
  expect._M_elems[6] = 6;
  expect._M_elems[7] = 0;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 8;
  expect._M_elems[2] = 9;
  expect._M_elems[3] = 3;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x13d,"void push_heap_suite::push_sequence()",aiStack_a8 + 1,expect._M_elems,
             expect._M_elems,&local_2c);
  aiStack_a8[8] = 1;
  uVar3 = 8;
  uVar4 = 4;
  do {
    iVar1 = aiStack_a8[uVar4];
    if (aiStack_a8[uVar3] <= iVar1) break;
    aiStack_a8[uVar4] = aiStack_a8[uVar3];
    aiStack_a8[uVar3] = iVar1;
    bVar2 = 1 < uVar4;
    uVar3 = uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 0;
  expect._M_elems[9] = 0;
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[4] = 5;
  expect._M_elems[5] = 2;
  expect._M_elems[6] = 6;
  expect._M_elems[7] = 1;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 8;
  expect._M_elems[2] = 9;
  expect._M_elems[3] = 3;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x144,"void push_heap_suite::push_sequence()",aiStack_a8 + 1,expect._M_elems,
             expect._M_elems,&local_2c);
  aiStack_a8[9] = 4;
  uVar3 = 9;
  uVar4 = 4;
  do {
    iVar1 = aiStack_a8[uVar4];
    if (aiStack_a8[uVar3] <= iVar1) break;
    aiStack_a8[uVar4] = aiStack_a8[uVar3];
    aiStack_a8[uVar3] = iVar1;
    bVar2 = 1 < uVar4;
    uVar3 = uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 3;
  expect._M_elems[9] = 0;
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[4] = 5;
  expect._M_elems[5] = 2;
  expect._M_elems[6] = 6;
  expect._M_elems[7] = 1;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 8;
  expect._M_elems[2] = 9;
  expect._M_elems[3] = 4;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x14b,"void push_heap_suite::push_sequence()",aiStack_a8 + 1,expect._M_elems,
             expect._M_elems,&local_2c);
  aiStack_a8[10] = 0xc;
  uVar3 = 10;
  uVar4 = 5;
  do {
    iVar1 = aiStack_a8[uVar4];
    if (aiStack_a8[uVar3] <= iVar1) break;
    aiStack_a8[uVar4] = aiStack_a8[uVar3];
    aiStack_a8[uVar3] = iVar1;
    bVar2 = 1 < uVar4;
    uVar3 = uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 3;
  expect._M_elems[9] = 5;
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[4] = 8;
  expect._M_elems[5] = 2;
  expect._M_elems[6] = 6;
  expect._M_elems[7] = 1;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 0xc;
  expect._M_elems[2] = 9;
  expect._M_elems[3] = 4;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x152,"void push_heap_suite::push_sequence()",aiStack_a8 + 1,expect._M_elems,
             expect._M_elems,&local_2c);
  aiStack_a8[0xb] = 7;
  uVar3 = 0xb;
  uVar4 = 5;
  do {
    iVar1 = aiStack_a8[uVar4];
    if (aiStack_a8[uVar3] <= iVar1) break;
    aiStack_a8[uVar4] = aiStack_a8[uVar3];
    aiStack_a8[uVar3] = iVar1;
    bVar2 = 1 < uVar4;
    uVar3 = uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 3;
  expect._M_elems[9] = 5;
  expect._M_elems[10] = 7;
  expect._M_elems[0xb] = 0;
  expect._M_elems[4] = 8;
  expect._M_elems[5] = 2;
  expect._M_elems[6] = 6;
  expect._M_elems[7] = 1;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 0xc;
  expect._M_elems[2] = 9;
  expect._M_elems[3] = 4;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x159,"void push_heap_suite::push_sequence()",aiStack_a8 + 1,expect._M_elems,
             expect._M_elems,&local_2c);
  aiStack_a8[0xc] = 10;
  uVar3 = 0xc;
  uVar4 = 6;
  do {
    iVar1 = aiStack_a8[uVar4];
    if (aiStack_a8[uVar3] <= iVar1) break;
    aiStack_a8[uVar4] = aiStack_a8[uVar3];
    aiStack_a8[uVar3] = iVar1;
    bVar2 = 1 < uVar4;
    uVar3 = uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 3;
  expect._M_elems[9] = 5;
  expect._M_elems[10] = 7;
  expect._M_elems[0xb] = 2;
  expect._M_elems[4] = 8;
  expect._M_elems[5] = 9;
  expect._M_elems[6] = 6;
  expect._M_elems[7] = 1;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 0xc;
  expect._M_elems[2] = 10;
  expect._M_elems[3] = 4;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x160,"void push_heap_suite::push_sequence()",aiStack_a8 + 1,expect._M_elems,
             expect._M_elems,&local_2c);
  aiStack_a8[0xd] = 0xd;
  uVar3 = 0xd;
  uVar4 = 6;
  do {
    iVar1 = aiStack_a8[uVar4];
    if (aiStack_a8[uVar3] <= iVar1) break;
    aiStack_a8[uVar4] = aiStack_a8[uVar3];
    aiStack_a8[uVar3] = iVar1;
    bVar2 = 1 < uVar4;
    uVar3 = uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  expect._M_elems[0xc] = 9;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 3;
  expect._M_elems[9] = 5;
  expect._M_elems[10] = 7;
  expect._M_elems[0xb] = 2;
  expect._M_elems[4] = 8;
  expect._M_elems[5] = 10;
  expect._M_elems[6] = 6;
  expect._M_elems[7] = 1;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 0xc;
  expect._M_elems[2] = 0xd;
  expect._M_elems[3] = 4;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x167,"void push_heap_suite::push_sequence()",aiStack_a8 + 1,expect._M_elems,
             expect._M_elems,&local_2c);
  aiStack_a8[0xe] = 0xb;
  uVar3 = 0xe;
  uVar4 = 7;
  do {
    iVar1 = aiStack_a8[uVar4];
    if (aiStack_a8[uVar3] <= iVar1) break;
    aiStack_a8[uVar4] = aiStack_a8[uVar3];
    aiStack_a8[uVar3] = iVar1;
    bVar2 = 1 < uVar4;
    uVar3 = uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  expect._M_elems[0xc] = 9;
  expect._M_elems[0xd] = 6;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 3;
  expect._M_elems[9] = 5;
  expect._M_elems[10] = 7;
  expect._M_elems[0xb] = 2;
  expect._M_elems[4] = 8;
  expect._M_elems[5] = 10;
  expect._M_elems[6] = 0xb;
  expect._M_elems[7] = 1;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 0xc;
  expect._M_elems[2] = 0xd;
  expect._M_elems[3] = 4;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x16e,"void push_heap_suite::push_sequence()",aiStack_a8 + 1,expect._M_elems,
             expect._M_elems,&local_2c);
  aiStack_a8[0xf] = 0xe;
  uVar3 = 0xf;
  uVar4 = 7;
  do {
    iVar1 = aiStack_a8[uVar4];
    if (aiStack_a8[uVar3] <= iVar1) break;
    aiStack_a8[uVar4] = aiStack_a8[uVar3];
    aiStack_a8[uVar3] = iVar1;
    bVar2 = 1 < uVar4;
    uVar3 = uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  expect._M_elems[0xc] = 9;
  expect._M_elems[0xd] = 6;
  expect._M_elems[0xe] = 0xb;
  expect._M_elems[8] = 3;
  expect._M_elems[9] = 5;
  expect._M_elems[10] = 7;
  expect._M_elems[0xb] = 2;
  expect._M_elems[4] = 8;
  expect._M_elems[5] = 10;
  expect._M_elems[6] = 0xd;
  expect._M_elems[7] = 1;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 0xc;
  expect._M_elems[2] = 0xe;
  expect._M_elems[3] = 4;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x175,"void push_heap_suite::push_sequence()",aiStack_a8 + 1,expect._M_elems,
             expect._M_elems,&local_2c);
  return;
}

Assistant:

void push_sequence()
{
    // 8 3 6 9 5 2 15 1 4 12 7 10 13 11 14

    std::array<int, 15> heap = {};
    auto last = heap.begin();
    *last++ = 8;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 8, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 3;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 8, 3, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 6;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 8, 3, 6, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 9;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 9, 8, 6, 3, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 5;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 9, 8, 6, 3, 5, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 2;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 9, 8, 6, 3, 5, 2, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 15;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 8, 9, 3, 5, 2, 6, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 1;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 8, 9, 3, 5, 2, 6, 1, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 4;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 8, 9, 4, 5, 2, 6, 1, 3, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 12;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 9, 4, 8, 2, 6, 1, 3, 5, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 7;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 9, 4, 8, 2, 6, 1, 3, 5, 7, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 10;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 10, 4, 8, 9, 6, 1, 3, 5, 7, 2, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 13;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 13, 4, 8, 10, 6, 1, 3, 5, 7, 2, 9, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 11;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 13, 4, 8, 10, 11, 1, 3, 5, 7, 2, 9, 6, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 14;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 14, 4, 8, 10, 13, 1, 3, 5, 7, 2, 9, 6, 11 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
}